

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O3

Yshort ** transpose(Yshort **R,int n)

{
  uint uVar1;
  int iVar2;
  undefined4 *puVar3;
  char *__ptr;
  ulong uVar4;
  Yshort **ppYVar5;
  char *__ptr_00;
  Yshort *pYVar6;
  uint *puVar7;
  ulong uVar8;
  
  uVar8 = (ulong)(uint)n;
  __ptr = allocate(n * 4);
  if (0 < n) {
    uVar4 = 0;
    do {
      puVar7 = (uint *)R[uVar4];
      if (puVar7 != (uint *)0x0) {
        uVar1 = *puVar7;
        while (-1 < (int)uVar1) {
          puVar7 = puVar7 + 1;
          *(int *)(__ptr + (ulong)uVar1 * 4) = *(int *)(__ptr + (ulong)uVar1 * 4) + 1;
          uVar1 = *puVar7;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar8);
  }
  ppYVar5 = (Yshort **)allocate(n * 8);
  __ptr_00 = allocate(n * 8);
  if (n < 1) {
    free(__ptr);
  }
  else {
    uVar4 = 0;
    do {
      iVar2 = *(int *)(__ptr + uVar4 * 4);
      if (0 < (long)iVar2) {
        pYVar6 = (Yshort *)allocate(iVar2 * 4 + 4);
        ppYVar5[uVar4] = pYVar6;
        *(Yshort **)(__ptr_00 + uVar4 * 8) = pYVar6;
        pYVar6[iVar2] = -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
    free(__ptr);
    if (0 < n) {
      uVar4 = 0;
      do {
        puVar7 = (uint *)R[uVar4];
        if (puVar7 != (uint *)0x0) {
          uVar1 = *puVar7;
          while (-1 < (int)uVar1) {
            puVar7 = puVar7 + 1;
            puVar3 = *(undefined4 **)(__ptr_00 + (ulong)uVar1 * 8);
            *(undefined4 **)(__ptr_00 + (ulong)uVar1 * 8) = puVar3 + 1;
            *puVar3 = (int)uVar4;
            uVar1 = *puVar7;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar8);
    }
  }
  free(__ptr_00);
  return ppYVar5;
}

Assistant:

Yshort **transpose(Yshort **R, int n)
{
  register Yshort **new_R;
  register Yshort **temp_R;
  register Yshort *nedges;
  register Yshort *sp;
  register int i;
  register int k;

  nedges = NEW2(n, Yshort);

  for (i = 0; i < n; i++)
    {
      sp = R[i];
      if (sp)
	{
	  while (*sp >= 0)
	    nedges[*sp++]++;
	}
    }

  new_R = NEW2(n, Yshort *);
  temp_R = NEW2(n, Yshort *);

  for (i = 0; i < n; i++)
    {
      k = nedges[i];
      if (k > 0)
	{
	  sp = NEW2(k + 1, Yshort);
	  new_R[i] = sp;
	  temp_R[i] = sp;
	  sp[k] = -1;
	}
    }

  FREE(nedges);

  for (i = 0; i < n; i++)
    {
      sp = R[i];
      if (sp)
	{
	  while (*sp >= 0)
	    *temp_R[*sp++]++ = i;
	}
    }

  FREE(temp_R);

  return (new_R);
}